

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void EDLines::SplitSegment2Lines
               (double *x,double *y,int noPixels,int segmentNo,
               vector<LineSegment,_std::allocator<LineSegment>_> *lines,int min_line_len,
               double line_error)

{
  vector<LineSegment,_std::allocator<LineSegment>_> *this;
  double dVar1;
  LineSegment local_f0;
  int local_a8;
  int local_a4;
  int noSkippedPixels;
  int index_1;
  double ey;
  double ex;
  double sy;
  double sx;
  double d;
  int local_70;
  int badPixelCount;
  int goodPixelCount;
  int lastGoodIndex;
  int startIndex;
  int len;
  int index;
  int lastInvert;
  double error;
  double lastB;
  double lastA;
  bool valid;
  double dStack_38;
  int firstPixelIndex;
  double line_error_local;
  vector<LineSegment,_std::allocator<LineSegment>_> *pvStack_28;
  int min_line_len_local;
  vector<LineSegment,_std::allocator<LineSegment>_> *lines_local;
  int segmentNo_local;
  int noPixels_local;
  double *y_local;
  double *x_local;
  
  lastA._4_4_ = 0;
  dStack_38 = line_error;
  line_error_local._4_4_ = min_line_len;
  pvStack_28 = lines;
  lines_local._0_4_ = segmentNo;
  lines_local._4_4_ = noPixels;
  _segmentNo_local = y;
  y_local = x;
  do {
    if (lines_local._4_4_ < line_error_local._4_4_) {
      return;
    }
    lastA._3_1_ = 0;
    for (; line_error_local._4_4_ <= lines_local._4_4_; lines_local._4_4_ = lines_local._4_4_ + -1)
    {
      LineFit(y_local,_segmentNo_local,line_error_local._4_4_,&lastB,&error,(double *)&index,&len);
      if (_index <= 0.5) {
        lastA._3_1_ = 1;
        break;
      }
      y_local = y_local + 1;
      _segmentNo_local = _segmentNo_local + 1;
      lastA._4_4_ = lastA._4_4_ + 1;
    }
    if ((lastA._3_1_ & 1) == 0) {
      return;
    }
    startIndex = line_error_local._4_4_;
    lastGoodIndex = line_error_local._4_4_;
    do {
      if (lines_local._4_4_ <= startIndex) goto LAB_0012fcb1;
      goodPixelCount = startIndex;
      badPixelCount = startIndex + -1;
      local_70 = 0;
      d._4_4_ = 0;
      for (; startIndex < lines_local._4_4_; startIndex = startIndex + 1) {
        sx = ComputeMinDistance(y_local[startIndex],_segmentNo_local[startIndex],lastB,error,len);
        if (dStack_38 < sx) {
          d._4_4_ = d._4_4_ + 1;
          if (4 < d._4_4_) break;
        }
        else {
          badPixelCount = startIndex;
          local_70 = local_70 + 1;
          d._4_4_ = 0;
        }
      }
      if (1 < local_70) {
        lastGoodIndex = (badPixelCount - goodPixelCount) + 1 + lastGoodIndex;
        LineFit(y_local,_segmentNo_local,lastGoodIndex,&lastB,&error,len);
        startIndex = badPixelCount + 1;
      }
    } while ((1 < local_70) && (startIndex < lines_local._4_4_));
    local_a4 = 0;
    while (dVar1 = ComputeMinDistance(y_local[local_a4],_segmentNo_local[local_a4],lastB,error,len),
          dStack_38 < dVar1) {
      local_a4 = local_a4 + 1;
    }
    ComputeClosestPoint(y_local[local_a4],_segmentNo_local[local_a4],lastB,error,len,&sy,&ex);
    local_a8 = local_a4;
    local_a4 = badPixelCount;
    while (dVar1 = ComputeMinDistance(y_local[local_a4],_segmentNo_local[local_a4],lastB,error,len),
          dStack_38 < dVar1) {
      local_a4 = local_a4 + -1;
    }
    ComputeClosestPoint(y_local[local_a4],_segmentNo_local[local_a4],lastB,error,len,&ey,
                        (double *)&noSkippedPixels);
    this = pvStack_28;
    LineSegment::LineSegment
              (&local_f0,lastB,error,len,sy,ex,ey,_noSkippedPixels,(int)lines_local,
               lastA._4_4_ + local_a8,(local_a4 - local_a8) + 1);
    std::vector<LineSegment,_std::allocator<LineSegment>_>::push_back(this,&local_f0);
    lastGoodIndex = local_a4 + 1;
LAB_0012fcb1:
    lines_local._4_4_ = lines_local._4_4_ - lastGoodIndex;
    y_local = y_local + lastGoodIndex;
    _segmentNo_local = _segmentNo_local + lastGoodIndex;
    lastA._4_4_ = lastGoodIndex + lastA._4_4_;
  } while( true );
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo, vector<LineSegment> &lines, int min_line_len, double line_error)
{
	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				//linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}